

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsColorizeEffect::draw(QGraphicsColorizeEffect *this,QPainter *painter)

{
  bool bVar1;
  QGraphicsColorizeEffectPrivate *pQVar2;
  ulong uVar3;
  void *__src;
  QPointF *in_RSI;
  QGraphicsEffect *in_RDI;
  long in_FS_OFFSET;
  QGraphicsColorizeEffectPrivate *d;
  QPixmap pixmap;
  QPixmap pixmap_1;
  QPoint offset;
  QTransform restoreTransform;
  QPoint *in_stack_fffffffffffffe68;
  QPointF *in_stack_fffffffffffffe70;
  QPointF *this_00;
  undefined8 in_stack_fffffffffffffe80;
  PixmapPadMode mode;
  QPointF *pQVar4;
  QPoint *in_stack_fffffffffffffe88;
  QPixmapColorizeFilter *pQVar5;
  undefined8 in_stack_fffffffffffffe90;
  CoordinateSystem system;
  QRectF local_140;
  undefined1 local_120 [16];
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  QRectF local_f8;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  system = (CoordinateSystem)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  mode = (PixmapPadMode)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsColorizeEffect *)0x4a4255);
  if ((*(uint *)&pQVar2->field_0xb0 & 1) == 0) {
    QGraphicsEffect::drawSource
              ((QGraphicsEffect *)in_stack_fffffffffffffe70,(QPainter *)in_stack_fffffffffffffe68);
  }
  else {
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffe70);
    bVar1 = QGraphicsEffect::sourceIsPixmap((QGraphicsEffect *)in_stack_fffffffffffffe70);
    if (bVar1) {
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap(in_RDI,system,in_stack_fffffffffffffe88,mode);
      uVar3 = QPixmap::isNull();
      if ((uVar3 & 1) == 0) {
        pQVar5 = pQVar2->filter;
        QPointF::QPointF(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        QRectF::QRectF(&local_f8);
        (**(code **)(*(long *)&pQVar5->super_QPixmapFilter + 0x68))
                  (pQVar5,in_RSI,local_d8,&local_c8,&local_f8);
      }
      QPixmap::~QPixmap((QPixmap *)&local_c8);
    }
    else {
      local_110 = &DAT_aaaaaaaaaaaaaaaa;
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap(in_RDI,system,in_stack_fffffffffffffe88,mode);
      uVar3 = QPixmap::isNull();
      if ((uVar3 & 1) == 0) {
        memcpy(local_58,&DAT_00b0d6f8,0x50);
        __src = (void *)QPainter::worldTransform();
        memcpy(local_58,__src,0x50);
        this_00 = in_RSI;
        QTransform::QTransform((QTransform *)in_RSI);
        QPainter::setWorldTransform((QTransform *)this_00,SUB81(local_a8,0));
        pQVar5 = pQVar2->filter;
        pQVar4 = in_RSI;
        QPointF::QPointF(this_00,in_stack_fffffffffffffe68);
        QRectF::QRectF(&local_140);
        (**(code **)(*(long *)&pQVar5->super_QPixmapFilter + 0x68))
                  (pQVar5,pQVar4,local_120,&local_110,&local_140);
        QPainter::setWorldTransform((QTransform *)in_RSI,SUB81(local_58,0));
      }
      QPixmap::~QPixmap((QPixmap *)&local_110);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsColorizeEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsColorizeEffect);

    if (!d->opaque) {
        drawSource(painter);
        return;
    }

    QPoint offset;
    if (sourceIsPixmap()) {
        // No point in drawing in device coordinates (pixmap will be scaled anyways).
        const QPixmap pixmap = sourcePixmap(Qt::LogicalCoordinates, &offset, NoPad);
        if (!pixmap.isNull())
            d->filter->draw(painter, offset, pixmap);

        return;
    }

    // Draw pixmap in deviceCoordinates to avoid pixmap scaling.
    const QPixmap pixmap = sourcePixmap(Qt::DeviceCoordinates, &offset);
    if (pixmap.isNull())
        return;

    QTransform restoreTransform = painter->worldTransform();
    painter->setWorldTransform(QTransform());
    d->filter->draw(painter, offset, pixmap);
    painter->setWorldTransform(restoreTransform);
}